

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Vector3f pbrt::SampleUniformHemisphere(Point2f *u)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  Vector3f VVar5;
  
  fVar1 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  auVar4._0_12_ = ZEXT812(0);
  auVar4._12_4_ = 0;
  auVar4 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar1 * fVar1)),auVar4);
  auVar4 = vsqrtss_avx(auVar4,auVar4);
  fVar3 = (u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  fVar2 = cosf(fVar3);
  fVar3 = sinf(fVar3);
  auVar4 = vinsertps_avx(ZEXT416((uint)(fVar2 * auVar4._0_4_)),ZEXT416((uint)(fVar3 * auVar4._0_4_))
                         ,0x10);
  VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar4._0_8_;
  VVar5.super_Tuple3<pbrt::Vector3,_float>.z = fVar1;
  return (Vector3f)VVar5.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU inline Vector3f SampleUniformHemisphere(const Point2f &u) {
    Float z = u[0];
    Float r = SafeSqrt(1 - Sqr(z));
    Float phi = 2 * Pi * u[1];
    return {r * std::cos(phi), r * std::sin(phi), z};
}